

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiveProxy.cpp
# Opt level: O1

bool __thiscall aeron::archive::ArchiveProxy::offer(ArchiveProxy *this,int32_t length)

{
  bool bVar1;
  undefined4 in_EAX;
  int64_t iVar2;
  SourcedException *pSVar3;
  char *pcVar4;
  int32_t iVar5;
  allocator local_95;
  undefined4 local_94;
  string local_90;
  string local_70;
  string local_50;
  
  iVar5 = this->retryAttempts_;
  local_94 = in_EAX;
  do {
    bVar1 = false;
    iVar2 = ExclusivePublication::offer
                      ((this->publication_).
                       super___shared_ptr<aeron::ExclusivePublication,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,&this->buffer_,0,length + 8,
                       (on_reserved_value_supplier_t *)
                       concurrent::logbuffer::DEFAULT_RESERVED_VALUE_SUPPLIER);
    if (iVar2 < 1) {
      if (iVar2 == -5) {
        pSVar3 = (SourcedException *)__cxa_allocate_exception(0x48);
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,"offer failed due to max position being reached","");
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,"bool aeron::archive::ArchiveProxy::offer(std::int32_t)","");
        pcVar4 = aeron::util::past_prefix
                           ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/ArchiveProxy.cpp"
                           );
        std::__cxx11::string::string((string *)&local_50,pcVar4,&local_95);
        aeron::util::SourcedException::SourcedException(pSVar3,&local_70,&local_90,&local_50,0x114);
        *(undefined ***)pSVar3 = &PTR__SourcedException_00162228;
        __cxa_throw(pSVar3,&ArchiveException::typeinfo,
                    aeron::util::SourcedException::~SourcedException);
      }
      if (iVar2 == -1) {
        pSVar3 = (SourcedException *)__cxa_allocate_exception(0x48);
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,"connection to the archive is no longer available","");
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,"bool aeron::archive::ArchiveProxy::offer(std::int32_t)","");
        pcVar4 = aeron::util::past_prefix
                           ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/ArchiveProxy.cpp"
                           );
        std::__cxx11::string::string((string *)&local_50,pcVar4,&local_95);
        aeron::util::SourcedException::SourcedException(pSVar3,&local_70,&local_90,&local_50,0x112);
        *(undefined ***)pSVar3 = &PTR__SourcedException_00162228;
        __cxa_throw(pSVar3,&ArchiveException::typeinfo,
                    aeron::util::SourcedException::~SourcedException);
      }
      if (iVar2 == -4) {
        pSVar3 = (SourcedException *)__cxa_allocate_exception(0x48);
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,"connection to the archive has been closed","");
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,"bool aeron::archive::ArchiveProxy::offer(std::int32_t)","");
        pcVar4 = aeron::util::past_prefix
                           ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/ArchiveProxy.cpp"
                           );
        std::__cxx11::string::string((string *)&local_50,pcVar4,&local_95);
        aeron::util::SourcedException::SourcedException(pSVar3,&local_70,&local_90,&local_50,0x110);
        *(undefined ***)pSVar3 = &PTR__SourcedException_00162228;
        __cxa_throw(pSVar3,&ArchiveException::typeinfo,
                    aeron::util::SourcedException::~SourcedException);
      }
      if (iVar5 < 2) {
        local_94 = 0;
        bVar1 = false;
        iVar5 = iVar5 + -1;
      }
      else {
        sched_yield();
        bVar1 = true;
        iVar5 = iVar5 + -1;
      }
    }
    else {
      local_94 = (undefined4)CONCAT71((int7)((ulong)iVar2 >> 8),1);
    }
    if (!bVar1) {
      return (bool)((byte)local_94 & 1);
    }
  } while( true );
}

Assistant:

bool ArchiveProxy::offer(std::int32_t length) {
    std::int32_t attempts = retryAttempts_;
    while (true) {
        std::int64_t result = publication_->offer(buffer_, 0, codecs::MessageHeader::encodedLength() + length);
        if (result > 0) {
            return true;
        }

        if (result == aeron::PUBLICATION_CLOSED) {
            throw ArchiveException("connection to the archive has been closed", SOURCEINFO);
        } else if (result == aeron::NOT_CONNECTED) {
            throw ArchiveException("connection to the archive is no longer available", SOURCEINFO);
        } else if (result == aeron::MAX_POSITION_EXCEEDED) {
            throw ArchiveException("offer failed due to max position being reached", SOURCEINFO);
        }

        if (--attempts <= 0) {
            return false;
        }

        idle_.idle();
    }
}